

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_sink.c
# Opt level: O0

void sink_remark_phi(jit_State *J)

{
  ushort uVar1;
  ushort uVar2;
  IRIns *pIVar3;
  IRIns *pIVar4;
  byte bVar5;
  IRIns *irr;
  IRIns *irl;
  IRIns *pIStack_18;
  int remark;
  IRIns *ir;
  jit_State *J_local;
  
  do {
    bVar5 = 0;
    for (pIStack_18 = (J->cur).ir + ((J->cur).nins - 1); (pIStack_18->field_1).o == '\x13';
        pIStack_18 = pIStack_18 + -1) {
      pIVar3 = (J->cur).ir;
      uVar1 = (pIStack_18->field_0).op1;
      pIVar4 = (J->cur).ir;
      uVar2 = (pIStack_18->field_0).op2;
      if (((((&pIVar3->field_1)[uVar1].t.irt ^ (&pIVar4->field_1)[uVar2].t.irt) & 0x20) != 0) ||
         ((&pIVar3->field_0)[uVar1].prev != (&pIVar4->field_0)[uVar2].prev)) {
        bVar5 = ((&pIVar3->field_1)[uVar1].t.irt & (&pIVar4->field_1)[uVar2].t.irt ^ 0xff) & 0x20 |
                bVar5;
        pIVar3 = (J->cur).ir;
        *(byte *)((long)pIVar3 + (ulong)(pIStack_18->field_0).op1 * 8 + 4) =
             *(byte *)((long)pIVar3 + (ulong)(pIStack_18->field_0).op1 * 8 + 4) | 0x20;
        pIVar3 = (J->cur).ir;
        *(byte *)((long)pIVar3 + (ulong)(pIStack_18->field_0).op2 * 8 + 4) =
             *(byte *)((long)pIVar3 + (ulong)(pIStack_18->field_0).op2 * 8 + 4) | 0x20;
      }
    }
  } while (bVar5 != 0);
  return;
}

Assistant:

static void sink_remark_phi(jit_State *J)
{
  IRIns *ir;
  int remark;
  do {
    remark = 0;
    for (ir = IR(J->cur.nins-1); ir->o == IR_PHI; ir--) {
      IRIns *irl = IR(ir->op1), *irr = IR(ir->op2);
      if (!((irl->t.irt ^ irr->t.irt) & IRT_MARK) && irl->prev == irr->prev)
	continue;
      remark |= (~(irl->t.irt & irr->t.irt) & IRT_MARK);
      irt_setmark(IR(ir->op1)->t);
      irt_setmark(IR(ir->op2)->t);
    }
  } while (remark);
}